

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O3

void reshape(GLFWwindow *window,int w,int h)

{
  float fVar1;
  int i;
  int i_4;
  long lVar2;
  long lVar3;
  float p;
  float fVar4;
  float fVar5;
  float fVar6;
  vec3 f;
  mat4x4 view;
  vec3 center;
  vec4 r;
  undefined8 local_120;
  float local_118;
  float local_114;
  undefined8 local_110;
  float local_108 [20];
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  float local_88 [4];
  float local_78 [5];
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined4 local_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  lVar3 = 0;
  (*glad_glViewport)(0,0,w,h);
  (*glad_glMatrixMode)(0x1701);
  local_78[4] = 2.857143 / ((float)w / (float)h);
  local_64 = 0;
  uStack_5c = 0;
  local_54 = 0x4036db6e;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0xbf800000bf806666;
  uStack_38 = 0;
  local_30 = 0xc0003333;
  (*glad_glLoadMatrixf)(local_78 + 4);
  (*glad_glMatrixMode)(0x1700);
  local_108[0x12] = 0.0;
  local_108[0x10] = 0.0;
  local_108[0x11] = 0.0;
  do {
    *(float *)((long)&local_114 + lVar3) =
         *(float *)((long)local_108 + lVar3 + 0x40) - *(float *)((long)&DAT_00123110 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  fVar4 = 0.0;
  lVar3 = 0;
  do {
    fVar4 = fVar4 + (&local_114)[lVar3] * (&local_114)[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  lVar3 = 0;
  do {
    (&local_114)[lVar3] = (&local_114)[lVar3] * (1.0 / fVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  fVar4 = (float)local_110;
  fVar6 = (float)((ulong)local_110 >> 0x20);
  local_120 = CONCAT44(fVar6 * 0.0 + local_114 * -0.0,fVar4 * 0.0 + fVar6);
  local_118 = fVar4 * -0.0 - local_114;
  fVar5 = 0.0;
  lVar3 = 0;
  do {
    fVar1 = *(float *)((long)&local_120 + lVar3 * 4);
    fVar5 = fVar5 + fVar1 * fVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (fVar5 < 0.0) {
    local_98 = ZEXT416((uint)local_114);
    local_a8 = local_110;
    uStack_a0 = 0;
    uStack_b4 = 0x80000000;
    uStack_b0 = 0x80000000;
    uStack_ac = 0x80000000;
    local_b8 = -local_114;
    fVar5 = sqrtf(fVar5);
    fVar4 = (float)local_a8;
    fVar6 = local_a8._4_4_;
    local_114 = (float)local_98._0_4_;
    local_108[2] = local_b8;
  }
  else {
    fVar5 = SQRT(fVar5);
    local_108[2] = -local_114;
  }
  lVar3 = 0;
  do {
    *(float *)((long)&local_120 + lVar3 * 4) =
         *(float *)((long)&local_120 + lVar3 * 4) * (1.0 / fVar5);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_108[0] = (float)local_120;
  local_108[1] = local_120._4_4_ * fVar6 - fVar4 * local_118;
  lVar3 = 0;
  local_108[3] = 0.0;
  local_108[4] = local_120._4_4_;
  local_108[5] = local_118 * local_114 - fVar6 * (float)local_120;
  local_108[6] = -fVar4;
  local_108[7] = 0.0;
  local_108[8] = local_118;
  local_108[9] = (float)local_120 * fVar4 - local_114 * local_120._4_4_;
  local_108[10] = -fVar6;
  local_108[0xb] = 0.0;
  local_108[0xc] = 0.0;
  local_108[0xd] = 0.0;
  local_108[0xe] = 0.0;
  local_108[0xf] = 1.0;
  local_78[0] = -0.0;
  local_78[1] = -0.0;
  local_78[2] = -641.0;
  local_78[3] = 0.0;
  do {
    local_88[0] = local_108[lVar3];
    local_88[1] = local_108[lVar3 + 4];
    local_88[2] = local_108[lVar3 + 8];
    local_88[3] = local_108[lVar3 + 0xc];
    fVar4 = 0.0;
    lVar2 = 0;
    do {
      fVar4 = fVar4 + local_78[lVar2] * local_88[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    local_108[lVar3 + 0xc] = fVar4 + local_108[lVar3 + 0xc];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  (*glad_glLoadMatrixf)(local_108);
  return;
}

Assistant:

void reshape( GLFWwindow* window, int w, int h )
{
   mat4x4 projection, view;

   glViewport( 0, 0, (GLsizei)w, (GLsizei)h );

   glMatrixMode( GL_PROJECTION );
   mat4x4_perspective( projection,
                       2.f * (float) atan2( RADIUS, 200.f ),
                       (float)w / (float)h,
                       1.f, VIEW_SCENE_DIST );
   glLoadMatrixf((const GLfloat*) projection);

   glMatrixMode( GL_MODELVIEW );
   {
      vec3 eye = { 0.f, 0.f, VIEW_SCENE_DIST };
      vec3 center = { 0.f, 0.f, 0.f };
      vec3 up = { 0.f, -1.f, 0.f };
      mat4x4_look_at( view, eye, center, up );
   }
   glLoadMatrixf((const GLfloat*) view);
}